

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingBoostTypes.cpp
# Opt level: O3

int main(void)

{
  SessionWriter *this;
  pthread_mutex_t *ppVar1;
  __atomic_base<unsigned_long> _Var2;
  node_ptr psVar3;
  node_ptr plVar4;
  long lVar5;
  undefined1 *puVar6;
  atomic<unsigned_long> aVar7;
  element_type *peVar8;
  shared_count sVar9;
  cx_string<2UL> cVar10;
  int iVar11;
  size_t sVar12;
  int *p;
  Session *pSVar13;
  undefined8 uVar14;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_01;
  basic_ostream<char,_std::char_traits<char>_> *out;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_02;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_03;
  long *in_FS_OFFSET;
  initializer_list<int> il;
  initializer_list<int> il_00;
  cx_string<8UL> cVar15;
  cx_string<14UL> cVar16;
  timespec ts;
  optional<int> bopt;
  scoped_ptr<int> bscoped;
  flat_map<int,_int,_std::less<int>,_void> bfm;
  optional<int> bemptyOpt;
  flat_set<int,_std::less<int>,_void> bfs;
  vector<int,_void,_void> bv;
  string str;
  map<int,_int,_std::less<int>,_void,_void> bm;
  set<int,_std::less<int>,_void,_void> bs;
  deque<int,_void,_void> bdq;
  undefined1 local_5f8 [24];
  pair<const_int,_int> local_5e0;
  scoped_ptr<bool> local_5d8;
  scoped_ptr<int> local_5d0;
  shared_ptr<int> local_5c8;
  flat_map<int,_int,_std::less<int>,_void> local_5b8;
  optional<int> local_5a0;
  flat_set<int,_std::less<int>,_void> local_598;
  vector<int,_void,_void> local_578;
  repr_t local_558;
  slist<int,_void> local_540;
  node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_int>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
  local_530;
  list<int,_void> local_510;
  undefined1 local_4f8 [16];
  _Alloc_hider local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  _Alloc_hider local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  _Alloc_hider local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  uint64_t local_488;
  _Alloc_hider local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  _Alloc_hider local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  undefined1 local_440 [16];
  _Alloc_hider local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  _Alloc_hider local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  _Alloc_hider local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  uint64_t local_3d0;
  _Alloc_hider local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  _Alloc_hider local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  undefined1 local_388 [16];
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Alloc_hider local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  _Alloc_hider local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  uint64_t local_318;
  _Alloc_hider local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Alloc_hider local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  undefined1 local_2d0 [16];
  _Alloc_hider local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Alloc_hider local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  _Alloc_hider local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  uint64_t local_260;
  _Alloc_hider local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 local_218 [16];
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  uint64_t local_1a8;
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined1 local_160 [16];
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  uint64_t local_f0;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_unsigned_long,_true,_void>_>
  local_a8;
  deque_base<boost::container::new_allocator<int>,_void> local_88;
  
  local_5f8._0_2_ = 1;
  local_5f8[2] = 0;
  local_5f8._3_5_ = 0x200;
  local_5f8._8_4_ = 3;
  local_88.members_.m_map = (ptr_alloc_ptr)0x0;
  local_88.members_.m_map_size = 0;
  local_88.members_.m_start.m_cur = (int *)0x0;
  local_88.members_.m_start.m_first = (int *)0x0;
  local_88.members_.m_start.m_last = (int *)0x0;
  local_88.members_.m_start.m_node = (index_pointer)0x0;
  local_88.members_.m_finish.m_cur = (int *)0x0;
  local_88.members_.m_finish.m_first = (int *)0x0;
  local_88.members_.m_finish.m_last = (int *)0x0;
  local_88.members_.m_finish.m_node = (index_pointer)0x0;
  boost::container::deque<int,void,void>::priv_range_initialize<int_const*>
            ((deque<int,void,void> *)&local_88,(int *)local_5f8,(int *)(local_5f8 + 0xc),(type *)0x0
            );
  local_5f8._0_2_ = 7;
  local_5f8[2] = 0;
  local_5f8._3_5_ = 0x800;
  local_5f8._8_4_ = 9;
  il._M_len = 3;
  il._M_array = (iterator)local_5f8;
  boost::container::list<int,_void>::list(&local_510,il,(ValueAllocator *)&local_530);
  local_5f8._0_2_ = 10;
  local_5f8[2] = '\0';
  local_5f8._3_5_ = 0x1400;
  local_5f8._8_4_ = 0x1e;
  il_00._M_len = 3;
  il_00._M_array = (iterator)local_5f8;
  boost::container::slist<int,_void>::slist(&local_540,il_00,(allocator_type *)&local_530);
  local_578.m_holder.m_start = (pointer)0x0;
  local_578.m_holder.m_size = 0;
  local_578.m_holder.m_capacity = 0;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar13 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8);
    puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
    if (puVar6 != local_5f8 + 0x10) {
      operator_delete(puVar6,local_5f8._16_8_ + 1);
    }
    __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
  }
  this = (SessionWriter *)(*in_FS_OFFSET + -0x38);
  if (0x80 < *(ushort *)(in_FS_OFFSET[-7] + 0x88)) {
LAB_00102ca2:
    local_5f8._0_2_ = 1;
    local_5f8[2] = 0;
    local_5f8._3_5_ = 0x100;
    local_5f8._8_4_ = 2;
    local_5f8._12_2_ = 4;
    local_5f8[0xe] = 0;
    local_5f8[0xf] = 0;
    local_5f8._16_8_ = 0x900000003;
    boost::container::dtl::tree<std::pair<int_const,int>,int,std::less<int>,void,void>::
    tree<std::pair<int_const,int>const*>
              ((tree<std::pair<int_const,int>,int,std::less<int>,void,void> *)&local_530,true,
               (pair<const_int,_int> *)local_5f8,&local_5e0);
    local_5f8._0_2_ = 4;
    local_5f8[2] = 0;
    local_5f8._3_5_ = 0x500;
    local_5f8._8_4_ = 6;
    boost::container::dtl::tree<int,void,std::less<int>,void,void>::tree<int_const*>
              ((tree<int,void,std::less<int>,void,void> *)&local_a8,true,(int *)local_5f8,
               (int *)(local_5f8 + 0xc));
    local_5f8._0_2_ = 1;
    local_5f8[2] = 0;
    local_5f8._3_5_ = 0x100;
    local_5f8._8_4_ = 2;
    local_5f8._12_2_ = 4;
    local_5f8[0xe] = 0;
    local_5f8[0xf] = 0;
    local_5f8._16_8_ = 0x900000003;
    local_5b8.m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
    local_5b8.m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
    local_5b8.m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<int,int>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,int>>>
    ::insert_unique<boost::container::dtl::pair<int,int>const*>
              ((flat_tree<boost::container::dtl::pair<int,int>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,int>>>
                *)&local_5b8,(pair<int,_int> *)local_5f8,(pair<int,_int> *)&local_5e0);
    local_5f8._0_2_ = 2;
    local_5f8[2] = '\0';
    local_5f8._3_5_ = 0x300;
    local_5f8._8_4_ = 5;
    local_5f8._12_2_ = 8;
    local_5f8[0xe] = '\0';
    local_5f8[0xf] = 0;
    local_598.super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>.m_data.
    m_seq.m_holder.m_start = (pointer)0x0;
    local_598.super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>.m_data.
    m_seq.m_holder.m_size = 0;
    local_598.super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>.m_data.
    m_seq.m_holder.m_capacity = 0;
    boost::container::dtl::flat_tree<int,boost::move_detail::identity<int>,std::less<int>,void>::
    insert_unique<int_const*>
              ((flat_tree<int,boost::move_detail::identity<int>,std::less<int>,void> *)&local_598,
               (int *)local_5f8,(int *)(local_5f8 + 0x10));
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar13 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8);
      puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
      if (puVar6 != local_5f8 + 0x10) {
        operator_delete(puVar6,local_5f8._16_8_ + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar13 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8
                    );
          puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
          if (puVar6 != local_5f8 + 0x10) {
            operator_delete(puVar6,local_5f8._16_8_ + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_4f8._0_8_ = 0;
        local_4f8._8_2_ = info;
        local_4e8._M_p = (pointer)&local_4d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"main","");
        local_4c8._M_p = (pointer)&local_4b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"main","");
        local_4a8._M_p = (pointer)&local_498;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                   ,"");
        local_488 = 0x2d;
        local_480._M_p = (pointer)&local_470;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_480,"Boost associative containers: {} {} {} {}","");
        cVar16 = binlog::detail::
                 concatenated_tags<char_const(&)[42],boost::container::map<int,int,std::less<int>,void,void>&,boost::container::set<int,std::less<int>,void,void>&,boost::container::flat_map<int,int,std::less<int>,void>&,boost::container::flat_set<int,std::less<int>,void>&>
                           ((char (*) [42])"Boost associative containers: {} {} {} {}",
                            (map<int,_int,_std::less<int>,_void,_void> *)&local_530,
                            (set<int,_std::less<int>,_void,_void> *)&local_a8,&local_5b8,&local_598)
        ;
        local_5f8._0_2_ = cVar16._data._0_2_;
        local_5f8[2] = cVar16._data[2];
        local_5f8._3_5_ = cVar16._data._3_5_;
        local_5f8._8_4_ = cVar16._data._8_4_;
        local_5f8[0xe] = cVar16._data[0xe];
        local_5f8._12_2_ = cVar16._data._12_2_;
        local_460._M_p = (pointer)&local_450;
        sVar12 = strlen(local_5f8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_460,local_5f8,local_5f8 + sVar12);
        iVar11 = pthread_mutex_lock(ppVar1);
        if (iVar11 != 0) goto LAB_0010456f;
        local_4f8._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_4f8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_p != &local_450) {
          operator_delete(local_460._M_p,local_450._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_p != &local_470) {
          operator_delete(local_480._M_p,local_470._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_p != &local_498) {
          operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_p != &local_4b8) {
          operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_p != &local_4d8) {
          operator_delete(local_4e8._M_p,local_4d8._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar7.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar13 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8);
        puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
        if (puVar6 != local_5f8 + 0x10) {
          operator_delete(puVar6,local_5f8._16_8_ + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_5f8._0_2_ = 0;
      local_5f8[2] = '\0';
      local_5f8._3_5_ = 0;
      local_5f8._8_4_ = 0;
      local_5f8._12_2_ = 0;
      local_5f8[0xe] = '\0';
      local_5f8[0xf] = 0;
      clock_gettime(0,(timespec *)local_5f8);
      binlog::SessionWriter::
      addEvent<boost::container::map<int,int,std::less<int>,void,void>&,boost::container::set<int,std::less<int>,void,void>&,boost::container::flat_map<int,int,std::less<int>,void>&,boost::container::flat_set<int,std::less<int>,void>&>
                (this,(uint64_t)aVar7.super___atomic_base<unsigned_long>._M_i,
                 CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_)) * 1000000000 +
                 CONCAT17(local_5f8[0xf],
                          CONCAT16(local_5f8[0xe],CONCAT24(local_5f8._12_2_,local_5f8._8_4_))),
                 (map<int,_int,_std::less<int>,_void,_void> *)&local_530,
                 (set<int,_std::less<int>,_void,_void> *)&local_a8,&local_5b8,&local_598);
    }
    boost::container::basic_string<char,_std::char_traits<char>,_void>::basic_string
              ((basic_string<char,_std::char_traits<char>,_void> *)&local_558.s_aligner,"foo");
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar13 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8);
      puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
      if (puVar6 != local_5f8 + 0x10) {
        operator_delete(puVar6,local_5f8._16_8_ + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar13 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8
                    );
          puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
          if (puVar6 != local_5f8 + 0x10) {
            operator_delete(puVar6,local_5f8._16_8_ + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_218._0_8_ = 0;
        local_218._8_2_ = info;
        local_208._M_p = (pointer)&local_1f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"main","");
        local_1e8._M_p = (pointer)&local_1d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"main","");
        local_1c8._M_p = (pointer)&local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                   ,"");
        local_1a8 = 0x33;
        local_1a0._M_p = (pointer)&local_190;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"Boost string: {}","");
        local_5c8.px = (element_type *)CONCAT62(local_5c8.px._2_6_,0x5b);
        local_5d0.px._0_2_ = 99;
        cVar10 = mserialize::cx_strcat<1ul,1ul>
                           ((cx_string<1UL> *)&local_5c8,(cx_string<1UL> *)&local_5d0);
        local_5f8._0_2_ = cVar10._data._0_2_;
        local_5f8[2] = '\0';
        local_180._M_p = (pointer)&local_170;
        sVar12 = strlen(local_5f8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,local_5f8,local_5f8 + sVar12);
        iVar11 = pthread_mutex_lock(ppVar1);
        if (iVar11 != 0) goto LAB_00104576;
        local_218._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_218,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_p != &local_170) {
          operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_p != &local_190) {
          operator_delete(local_1a0._M_p,local_190._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_p != &local_1b8) {
          operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_p != &local_1d8) {
          operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_p != &local_1f8) {
          operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar7.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar13 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8);
        puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
        if (puVar6 != local_5f8 + 0x10) {
          operator_delete(puVar6,local_5f8._16_8_ + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_5f8._0_2_ = 0;
      local_5f8[2] = '\0';
      local_5f8._3_5_ = 0;
      local_5f8._8_4_ = 0;
      local_5f8._12_2_ = 0;
      local_5f8[0xe] = '\0';
      local_5f8[0xf] = 0;
      clock_gettime(0,(timespec *)local_5f8);
      binlog::SessionWriter::
      addEvent<boost::container::basic_string<char,std::char_traits<char>,void>&>
                (this,(uint64_t)aVar7.super___atomic_base<unsigned_long>._M_i,
                 CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_)) * 1000000000 +
                 CONCAT17(local_5f8[0xf],
                          CONCAT16(local_5f8[0xe],CONCAT24(local_5f8._12_2_,local_5f8._8_4_))),
                 (basic_string<char,_std::char_traits<char>,_void> *)&local_558.s_aligner);
    }
    local_5d0.px = (int *)operator_new(4);
    *local_5d0.px = 1;
    p = (int *)operator_new(4);
    *p = 2;
    boost::shared_ptr<int>::shared_ptr<int>(&local_5c8,p);
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar13 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8);
      puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
      if (puVar6 != local_5f8 + 0x10) {
        operator_delete(puVar6,local_5f8._16_8_ + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar13 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8
                    );
          puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
          if (puVar6 != local_5f8 + 0x10) {
            operator_delete(puVar6,local_5f8._16_8_ + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_2d0._0_8_ = 0;
        local_2d0._8_2_ = info;
        local_2c0._M_p = (pointer)&local_2b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"main","");
        local_2a0._M_p = (pointer)&local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"main","");
        local_280._M_p = (pointer)&local_270;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                   ,"");
        local_260 = 0x3a;
        local_258._M_p = (pointer)&local_248;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_258,"Boost pointers: {} {}","");
        cVar15 = binlog::detail::
                 concatenated_tags<char_const(&)[22],boost::scoped_ptr<int>&,boost::shared_ptr<int>&>
                           ((char (*) [22])0x1151aa,&local_5d0,&local_5c8);
        local_5f8._0_2_ = cVar15._data._0_2_;
        local_5f8[2] = cVar15._data[2];
        local_5f8._3_5_ = cVar15._data._3_5_;
        local_5f8[8] = cVar15._data[8];
        local_238._M_p = (pointer)&local_228;
        sVar12 = strlen(local_5f8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,local_5f8,local_5f8 + sVar12);
        iVar11 = pthread_mutex_lock(ppVar1);
        if (iVar11 != 0) goto LAB_0010457d;
        local_2d0._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_2d0,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_p != &local_228) {
          operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_p != &local_248) {
          operator_delete(local_258._M_p,local_248._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_p != &local_270) {
          operator_delete(local_280._M_p,local_270._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_p != &local_290) {
          operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_p != &local_2b0) {
          operator_delete(local_2c0._M_p,local_2b0._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar7.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar13 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8);
        puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
        if (puVar6 != local_5f8 + 0x10) {
          operator_delete(puVar6,local_5f8._16_8_ + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_5f8._0_2_ = 0;
      local_5f8[2] = 0;
      local_5f8._3_5_ = 0;
      local_5f8._8_4_ = 0;
      local_5f8._12_2_ = 0;
      local_5f8[0xe] = 0;
      local_5f8[0xf] = 0;
      clock_gettime(0,(timespec *)local_5f8);
      binlog::SessionWriter::addEvent<boost::scoped_ptr<int>&,boost::shared_ptr<int>&>
                (this,(uint64_t)aVar7.super___atomic_base<unsigned_long>._M_i,
                 CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_)) * 1000000000 +
                 CONCAT17(local_5f8[0xf],
                          CONCAT16(local_5f8[0xe],CONCAT24(local_5f8._12_2_,local_5f8._8_4_))),
                 &local_5d0,&local_5c8);
    }
    sVar9.pi_ = local_5c8.pn.pi_;
    peVar8 = local_5c8.px;
    local_5c8.px = (element_type *)0x0;
    local_5c8.pn.pi_ = (sp_counted_base *)0x0;
    local_5f8._0_2_ = SUB82(peVar8,0);
    local_5f8[2] = (char)((ulong)peVar8 >> 0x10);
    local_5f8._3_5_ = (undefined5)((ulong)peVar8 >> 0x18);
    local_5f8._8_4_ = SUB84(sVar9.pi_,0);
    local_5f8._12_2_ = (undefined2)((ulong)sVar9.pi_ >> 0x20);
    local_5f8[0xe] = (char)((ulong)sVar9.pi_ >> 0x30);
    local_5f8[0xf] = (undefined1)((ulong)sVar9.pi_ >> 0x38);
    boost::detail::shared_count::~shared_count((shared_count *)(local_5f8 + 8));
    out = extraout_RDX;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar13 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8);
      puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
      if (puVar6 != local_5f8 + 0x10) {
        operator_delete(puVar6,local_5f8._16_8_ + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      out = extraout_RDX_02;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar13 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8
                    );
          puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
          if (puVar6 != local_5f8 + 0x10) {
            operator_delete(puVar6,local_5f8._16_8_ + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_388._0_8_ = 0;
        local_388._8_2_ = info;
        local_378._M_p = (pointer)&local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"main","");
        local_358._M_p = (pointer)&local_348;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"main","");
        local_338._M_p = (pointer)&local_328;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_338,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                   ,"");
        local_318 = 0x3e;
        local_310._M_p = (pointer)&local_300;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_310,"Empty Boost pointers: {} {}","");
        local_5d8.px = (bool *)0x0;
        cVar15 = binlog::detail::
                 concatenated_tags<char_const(&)[28],boost::scoped_ptr<bool>,boost::shared_ptr<int>&>
                           ((char (*) [28])"Empty Boost pointers: {} {}",&local_5d8,&local_5c8);
        local_5f8._0_2_ = cVar15._data._0_2_;
        local_5f8[2] = cVar15._data[2];
        local_5f8._3_5_ = cVar15._data._3_5_;
        local_5f8[8] = cVar15._data[8];
        local_2f0._M_p = (pointer)&local_2e0;
        sVar12 = strlen(local_5f8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f0,local_5f8,local_5f8 + sVar12);
        iVar11 = pthread_mutex_lock(ppVar1);
        if (iVar11 != 0) goto LAB_00104584;
        local_388._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_388,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_p != &local_2e0) {
          operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_p != &local_300) {
          operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_p != &local_328) {
          operator_delete(local_338._M_p,local_328._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_p != &local_348) {
          operator_delete(local_358._M_p,local_348._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_p != &local_368) {
          operator_delete(local_378._M_p,local_368._M_allocated_capacity + 1);
        }
        operator_delete(local_5d8.px,1);
        LOCK();
        UNLOCK();
        main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar7.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar13 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8);
        puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
        if (puVar6 != local_5f8 + 0x10) {
          operator_delete(puVar6,local_5f8._16_8_ + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_5f8._0_2_ = 0;
      local_5f8[2] = 0;
      local_5f8._3_5_ = 0;
      local_5f8._8_4_ = 0;
      local_5f8._12_2_ = 0;
      local_5f8[0xe] = '\0';
      local_5f8[0xf] = 0;
      clock_gettime(0,(timespec *)local_5f8);
      lVar5 = CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
      local_5f8._0_2_ = 0;
      local_5f8[2] = '\0';
      local_5f8._3_5_ = 0;
      binlog::SessionWriter::addEvent<boost::scoped_ptr<bool>,boost::shared_ptr<int>&>
                (this,(uint64_t)aVar7.super___atomic_base<unsigned_long>._M_i,
                 lVar5 * 1000000000 +
                 CONCAT17(local_5f8[0xf],
                          CONCAT16(local_5f8[0xe],CONCAT24(local_5f8._12_2_,local_5f8._8_4_))),
                 (scoped_ptr<bool> *)local_5f8,&local_5c8);
      operator_delete((void *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_)),1);
      out = extraout_RDX_00;
    }
    local_5d8.px._0_1_ = 1;
    local_5d8.px._4_4_ = 0x7b;
    local_5a0.super_type.m_initialized = false;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar13 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8);
      puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
      if (puVar6 != local_5f8 + 0x10) {
        operator_delete(puVar6,local_5f8._16_8_ + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      out = extraout_RDX_03;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar13 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8
                    );
          puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
          if (puVar6 != local_5f8 + 0x10) {
            operator_delete(puVar6,local_5f8._16_8_ + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_440._0_8_ = 0;
        local_440._8_2_ = info;
        local_430._M_p = (pointer)&local_420;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"main","");
        local_410._M_p = (pointer)&local_400;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"main","");
        local_3f0._M_p = (pointer)&local_3e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                   ,"");
        local_3d0 = 0x4a;
        local_3c8._M_p = (pointer)&local_3b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3c8,"Boost optionals: {} {}","");
        cVar15 = binlog::detail::
                 concatenated_tags<char_const(&)[23],boost::optional<int>&,boost::optional<int>&>
                           ((char (*) [23])"Boost optionals: {} {}",(optional<int> *)&local_5d8,
                            &local_5a0);
        local_5f8._0_2_ = cVar15._data._0_2_;
        local_5f8[2] = cVar15._data[2];
        local_5f8._3_5_ = cVar15._data._3_5_;
        local_5f8[8] = cVar15._data[8];
        local_3a8._M_p = (pointer)&local_398;
        sVar12 = strlen(local_5f8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3a8,local_5f8,local_5f8 + sVar12);
        iVar11 = pthread_mutex_lock(ppVar1);
        if (iVar11 != 0) goto LAB_0010458b;
        local_440._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_440,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_p != &local_398) {
          operator_delete(local_3a8._M_p,local_398._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_p != &local_3b8) {
          operator_delete(local_3c8._M_p,local_3b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_p != &local_3e0) {
          operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_p != &local_400) {
          operator_delete(local_410._M_p,local_400._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_p != &local_420) {
          operator_delete(local_430._M_p,local_420._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar7.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar13 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8);
        puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
        if (puVar6 != local_5f8 + 0x10) {
          operator_delete(puVar6,local_5f8._16_8_ + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_5f8._0_2_ = 0;
      local_5f8[2] = '\0';
      local_5f8._3_5_ = 0;
      local_5f8._8_4_ = 0;
      local_5f8._12_2_ = 0;
      local_5f8[0xe] = '\0';
      local_5f8[0xf] = 0;
      clock_gettime(0,(timespec *)local_5f8);
      binlog::SessionWriter::addEvent<boost::optional<int>&,boost::optional<int>&>
                (this,(uint64_t)aVar7.super___atomic_base<unsigned_long>._M_i,
                 CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_)) * 1000000000 +
                 CONCAT17(local_5f8[0xf],
                          CONCAT16(local_5f8[0xe],CONCAT24(local_5f8._12_2_,local_5f8._8_4_))),
                 (optional<int> *)&local_5d8,&local_5a0);
      out = extraout_RDX_01;
    }
    binlog::consume<std::ostream>((ConsumeResult *)local_5f8,(binlog *)&std::cout,out);
    boost::detail::shared_count::~shared_count(&local_5c8.pn);
    operator_delete(local_5d0.px,4);
    if ((((local_558.data[0] & 1) == 0) && ((void *)local_558._16_8_ != (void *)0x0)) &&
       (0x17 < (ulong)local_558._8_8_)) {
      operator_delete((void *)local_558._16_8_);
    }
    if (local_598.super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>.
        m_data.m_seq.m_holder.m_capacity != 0) {
      operator_delete(local_598.
                      super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>.
                      m_data.m_seq.m_holder.m_start);
    }
    if (local_5b8.m_flat_tree.m_data.m_seq.m_holder.m_capacity != 0) {
      operator_delete(local_5b8.m_flat_tree.m_data.m_seq.m_holder.m_start);
    }
    boost::container::dtl::
    node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_unsigned_long,_true,_void>_>
    ::~node_alloc_holder(&local_a8);
    boost::container::dtl::
    node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_int>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
    ::~node_alloc_holder(&local_530);
    if (local_578.m_holder.m_capacity != 0) {
      operator_delete(local_578.m_holder.m_start);
    }
    while (local_540.
           super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
           .m_icont.data_.root_plus_size_.super_header_holder_plus_last_t.header_holder_.super_node.
           next_ != (default_header_holder<boost::intrusive::slist_node_traits<void_*>_>)
                    &local_540.
                     super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
                     .m_icont.data_.root_plus_size_.super_header_holder_plus_last_t) {
      psVar3 = ((node_ptr)
               local_540.
               super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
               .m_icont.data_.root_plus_size_.super_header_holder_plus_last_t.header_holder_.
               super_node.next_)->next_;
      operator_delete((void *)local_540.
                              super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
                              .m_icont.data_.root_plus_size_.super_header_holder_plus_last_t.
                              header_holder_.super_node.next_);
      local_540.
      super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
      .m_icont.data_.root_plus_size_.super_header_holder_plus_last_t.header_holder_.super_node.next_
           = (default_header_holder<boost::intrusive::slist_node_traits<void_*>_>)
             (default_header_holder<boost::intrusive::slist_node_traits<void_*>_>)psVar3;
    }
    while (local_510.
           super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
           .m_icont.data_.root_plus_size_.m_header.super_node.next_ !=
           &local_510.
            super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
            .m_icont.data_.root_plus_size_.m_header.super_node) {
      plVar4 = (local_510.
                super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
                .m_icont.data_.root_plus_size_.m_header.super_node.next_)->next_;
      operator_delete(local_510.
                      super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
                      .m_icont.data_.root_plus_size_.m_header.super_node.next_);
      local_510.
      super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
      .m_icont.data_.root_plus_size_.m_header.super_node.next_ = plVar4;
    }
    boost::container::deque_base<boost::container::new_allocator<int>,_void>::~deque_base(&local_88)
    ;
    return 0;
  }
  if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i != 0) {
LAB_00102c43:
    aVar7.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar13 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8);
      puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
      if (puVar6 != local_5f8 + 0x10) {
        operator_delete(puVar6,local_5f8._16_8_ + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    local_5f8._0_2_ = 0;
    local_5f8[2] = 0;
    local_5f8._3_5_ = 0;
    local_5f8._8_4_ = 0;
    local_5f8._12_2_ = 0;
    local_5f8[0xe] = 0;
    local_5f8[0xf] = 0;
    clock_gettime(0,(timespec *)local_5f8);
    binlog::SessionWriter::
    addEvent<boost::container::deque<int,void,void>&,boost::container::list<int,void>&,boost::container::slist<int,void>&,boost::container::vector<int,void,void>&>
              (this,(uint64_t)aVar7.super___atomic_base<unsigned_long>._M_i,
               CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_)) * 1000000000 +
               CONCAT17(local_5f8[0xf],
                        CONCAT16(local_5f8[0xe],CONCAT24(local_5f8._12_2_,local_5f8._8_4_))),
               (deque<int,_void,_void> *)&local_88,&local_510,&local_540,&local_578);
    goto LAB_00102ca2;
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar13 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar13,0x100000,0,(string *)local_5f8);
    puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
    if (puVar6 != local_5f8 + 0x10) {
      operator_delete(puVar6,local_5f8._16_8_ + 1);
    }
    __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
  }
  ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
  local_160._0_8_ = 0;
  local_160._8_2_ = info;
  local_150._M_p = (pointer)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"main","");
  local_130._M_p = (pointer)&local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"main","");
  local_110._M_p = (pointer)&local_100;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
             ,"");
  local_f0 = 0x26;
  local_e8._M_p = (pointer)&local_d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"Boost sequence containers: {} {} {} {}","");
  cVar15 = binlog::detail::
           concatenated_tags<char_const(&)[39],boost::container::deque<int,void,void>&,boost::container::list<int,void>&,boost::container::slist<int,void>&,boost::container::vector<int,void,void>&>
                     ((char (*) [39])"Boost sequence containers: {} {} {} {}",
                      (deque<int,_void,_void> *)&local_88,&local_510,&local_540,&local_578);
  local_5f8._0_2_ = cVar15._data._0_2_;
  local_5f8[2] = cVar15._data[2];
  local_5f8._3_5_ = cVar15._data._3_5_;
  local_5f8[8] = cVar15._data[8];
  local_c8._M_p = (pointer)&local_b8;
  sVar12 = strlen(local_5f8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,local_5f8,local_5f8 + sVar12);
  iVar11 = pthread_mutex_lock(ppVar1);
  if (iVar11 == 0) {
    local_160._0_8_ = ppVar1[3].__align;
    binlog::
    serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
              ((EventSource *)local_160,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
    _Var2._M_i = ppVar1[3].__align;
    ppVar1[3].__align = _Var2._M_i + 1;
    pthread_mutex_unlock(ppVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_p != &local_d8) {
      operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_p != &local_100) {
      operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_p != &local_120) {
      operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_p != &local_140) {
      operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
    }
    LOCK();
    UNLOCK();
    main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    goto LAB_00102c43;
  }
  iVar11 = std::__throw_system_error(iVar11);
LAB_0010456f:
  iVar11 = std::__throw_system_error(iVar11);
LAB_00104576:
  iVar11 = std::__throw_system_error(iVar11);
LAB_0010457d:
  iVar11 = std::__throw_system_error(iVar11);
LAB_00104584:
  iVar11 = std::__throw_system_error(iVar11);
LAB_0010458b:
  uVar14 = std::__throw_system_error(iVar11);
  puVar6 = (undefined1 *)CONCAT53(local_5f8._3_5_,CONCAT12(local_5f8[2],local_5f8._0_2_));
  if (puVar6 != local_5f8 + 0x10) {
    operator_delete(puVar6,local_5f8._16_8_ + 1);
  }
  boost::detail::shared_count::~shared_count(&local_5c8.pn);
  operator_delete(local_5d0.px,4);
  if ((((local_558.data[0] & 1) == 0) && ((void *)local_558._16_8_ != (void *)0x0)) &&
     (0x17 < (ulong)local_558._8_8_)) {
    operator_delete((void *)local_558._16_8_);
  }
  if (local_598.super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>.m_data
      .m_seq.m_holder.m_capacity != 0) {
    operator_delete(local_598.
                    super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>.
                    m_data.m_seq.m_holder.m_start);
  }
  if (local_5b8.m_flat_tree.m_data.m_seq.m_holder.m_capacity != 0) {
    operator_delete(local_5b8.m_flat_tree.m_data.m_seq.m_holder.m_start);
  }
  boost::container::dtl::
  node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_unsigned_long,_true,_void>_>
  ::~node_alloc_holder(&local_a8);
  boost::container::dtl::
  node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_int>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
  ::~node_alloc_holder(&local_530);
  if (local_578.m_holder.m_capacity != 0) {
    operator_delete(local_578.m_holder.m_start);
  }
  while (local_540.
         super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
         .m_icont.data_.root_plus_size_.super_header_holder_plus_last_t.header_holder_.super_node.
         next_ != (default_header_holder<boost::intrusive::slist_node_traits<void_*>_>)
                  &local_540.
                   super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
                   .m_icont.data_.root_plus_size_.super_header_holder_plus_last_t) {
    psVar3 = ((node_ptr)
             local_540.
             super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
             .m_icont.data_.root_plus_size_.super_header_holder_plus_last_t.header_holder_.
             super_node.next_)->next_;
    operator_delete((void *)local_540.
                            super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
                            .m_icont.data_.root_plus_size_.super_header_holder_plus_last_t.
                            header_holder_.super_node.next_);
    local_540.
    super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
    .m_icont.data_.root_plus_size_.super_header_holder_plus_last_t.header_holder_.super_node.next_ =
         (default_header_holder<boost::intrusive::slist_node_traits<void_*>_>)
         (default_header_holder<boost::intrusive::slist_node_traits<void_*>_>)psVar3;
  }
  while (local_510.
         super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
         .m_icont.data_.root_plus_size_.m_header.super_node.next_ !=
         &local_510.
          super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
          .m_icont.data_.root_plus_size_.m_header.super_node) {
    plVar4 = (local_510.
              super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
              .m_icont.data_.root_plus_size_.m_header.super_node.next_)->next_;
    operator_delete(local_510.
                    super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
                    .m_icont.data_.root_plus_size_.m_header.super_node.next_);
    local_510.
    super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
    .m_icont.data_.root_plus_size_.m_header.super_node.next_ = plVar4;
  }
  boost::container::deque_base<boost::container::new_allocator<int>,_void>::~deque_base(&local_88);
  _Unwind_Resume(uVar14);
}

Assistant:

int main()
{
  // Boost containers - no specific adoption is required

  boost::container::deque<int> bdq{1,2,3};
  boost::container::list<int> bl{7,8,9};
  boost::container::slist<int> bsl{10,20,30};
  boost::container::vector<int> bv{};
  BINLOG_INFO("Boost sequence containers: {} {} {} {}", bdq, bl, bsl, bv);
  // Outputs: Boost sequence containers: [1, 2, 3] [7, 8, 9] [10, 20, 30] []

  boost::container::map<int,int> bm{{1,1},{2,4},{3,9}};
  boost::container::set<int> bs{4,5,6};
  boost::container::flat_map<int,int> bfm{{1,1},{2,4},{3,9}};
  boost::container::flat_set<int> bfs{2,3,5,8};
  BINLOG_INFO("Boost associative containers: {} {} {} {}", bm, bs, bfm, bfs);
  // Outputs: Boost associative containers: [(1, 1), (2, 4), (3, 9)] [4, 5, 6] [(1, 1), (2, 4), (3, 9)] [2, 3, 5, 8]

  // Boost string - no specific adoption is required

  boost::container::string str = "foo";
  BINLOG_INFO("Boost string: {}", str);
  // Outputs: Boost string: foo

  // Boost pointers - no specific adoption is required

  boost::scoped_ptr<int> bscoped(new int(1));
  boost::shared_ptr<int> bshared(new int(2));
  BINLOG_INFO("Boost pointers: {} {}", bscoped, bshared);
  // Outputs: Boost pointers: 1 2

  bshared.reset();
  BINLOG_INFO("Empty Boost pointers: {} {}", boost::scoped_ptr<bool>{}, bshared);
  // Outputs: Empty Boost pointers: {null} {null}

  static_assert(
    !mserialize::detail::is_serializable<boost::weak_ptr<int>>::value,
    "boost::weak_ptr is not loggable"
  );

  // Boost optional - loggable with the is_optional specialization above

  boost::optional<int> bopt(123);
  boost::optional<int> bemptyOpt;
  BINLOG_INFO("Boost optionals: {} {}", bopt, bemptyOpt);
  // Outputs: Boost optionals: 123 {null}

  binlog::consume(std::cout);
  return 0;
}